

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position_third_step2.cpp
# Opt level: O3

bool __thiscall
ruckig::PositionThirdOrderStep2::time_acc0
          (PositionThirdOrderStep2 *this,Profile *profile,double vMax,double vMin,double aMax,
          double aMin,double jMax)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  double dVar11;
  
  dVar2 = this->jMax_jMax;
  dVar2 = (this->tf * aMax - this->vd) / jMax +
          (this->ad_ad / (dVar2 + dVar2) - ((aMax - this->a0) * this->ad) / dVar2);
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  (profile->t)._M_elems[0] = (aMax - this->a0) / jMax;
  (profile->t)._M_elems[1] = (this->tf - this->ad / jMax) - (dVar2 + dVar2);
  (profile->t)._M_elems[2] = dVar2;
  (profile->t)._M_elems[3] = 0.0;
  (profile->t)._M_elems[4] = (this->af - aMax) / jMax + dVar2;
  (profile->t)._M_elems[5] = 0.0;
  (profile->t)._M_elems[6] = 0.0;
  bVar1 = Profile::check<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7,false>
                    (profile,jMax,vMax,vMin,aMax,aMin);
  if (!bVar1) {
    dVar11 = jMax + jMax;
    dVar2 = this->vd;
    dVar4 = this->tf;
    dVar3 = this->af;
    dVar10 = (aMax * dVar4 - dVar2) * dVar11 + this->ad * -2.0 * aMax + (this->af_af - this->a0_a0);
    dVar5 = jMax * 3.0;
    dVar9 = aMax * aMax;
    dVar2 = (((aMax + aMax) * jMax * dVar4 + dVar9) - dVar2 * dVar11) * dVar3 * 3.0 +
            ((this->a0 * -3.0 * aMax * (dVar11 * dVar4 + (aMax - (dVar3 + dVar3))) +
             this->a0_a0 * -3.0 * (dVar3 - jMax * dVar4) +
             this->af_af * -6.0 * aMax + this->af_p3 + this->af_p3 + this->a0_p3) -
            (((dVar4 + dVar4) * this->v0 + (this->tf_tf * aMax - (this->pd + this->pd))) * jMax +
            (aMax * dVar4 - (dVar2 + dVar2)) * aMax) * dVar5);
    dVar2 = dVar2 * 4.0 * dVar2 + dVar10 * -18.0 * dVar10 * dVar10;
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    dVar10 = dVar10 * dVar5;
    dVar3 = (aMax - this->a0) / jMax;
    (profile->t)._M_elems[0] = dVar3;
    dVar5 = dVar5 * this->tf;
    dVar4 = this->vd;
    dVar6 = dVar4 * jMax + dVar9;
    dVar2 = dVar2 * ABS(jMax);
    dVar4 = (((this->af_af - (dVar6 + dVar6)) * this->a0 * 3.0 +
             (dVar9 - dVar4 * jMax) * this->af * 6.0 +
             (this->af * -3.0 + aMax * 6.0 + dVar5) * this->a0_a0 +
             (aMax * -6.0 + dVar5) * this->af_af + (this->af_p3 - this->a0_p3)) -
            ((this->tf * aMax - (dVar4 + dVar4)) * aMax + this->g2 * jMax) * jMax * 6.0) / dVar10;
    (profile->t)._M_elems[1] = dVar4;
    dVar5 = (this->tf * 0.5 - (dVar2 / dVar10 + this->ad) / dVar11) - dVar4 * 0.5;
    (profile->t)._M_elems[2] = dVar5;
    dVar2 = dVar2 / (dVar10 * jMax);
    (profile->t)._M_elems[3] = dVar2;
    (profile->t)._M_elems[4] = 0.0;
    (profile->t)._M_elems[5] = 0.0;
    (profile->t)._M_elems[6] = this->tf - (dVar4 + dVar3 + dVar5 + dVar2);
    bVar1 = Profile::check<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7,false>
                      (profile,jMax,vMax,vMin,aMax,aMin);
    if (!bVar1) {
      dVar2 = this->af;
      dVar4 = this->tf;
      dVar3 = this->a0 + dVar2;
      dVar5 = ((dVar2 - aMax) * 6.0 * jMax * this->vd +
              this->jMax_jMax * -6.0 * this->g1 +
              ((dVar2 - (aMax + aMax)) + jMax * dVar4) * this->a0_a0 * 3.0 +
              (aMax * 3.0 - (dVar2 + dVar2)) * this->a0 * 3.0 * aMax +
              (jMax * dVar4 + dVar2) * aMax * 9.0 * aMax +
              dVar3 * -6.0 * aMax * jMax * dVar4 +
              (dVar9 + this->af_af) * -6.0 * aMax + this->af_p3 + this->af_p3 + this->a0_p3) -
              aMax * 3.0 * this->jMax_jMax * this->tf_tf;
      dVar2 = (this->vd - dVar4 * aMax) * jMax + (dVar9 - dVar3 * aMax);
      dVar4 = dVar2 + dVar2 + this->af_af + this->a0_a0;
      dVar2 = dVar5 * 4.0 * dVar5 + dVar4 * -18.0 * dVar4 * dVar4;
      if (dVar2 < 0.0) {
        dVar2 = sqrt(dVar2);
      }
      else {
        dVar2 = SQRT(dVar2);
      }
      dVar2 = (ABS(jMax) / jMax) * dVar2;
      dVar4 = jMax * 6.0 * dVar4;
      dVar3 = (aMax - this->a0) / jMax;
      (profile->t)._M_elems[0] = dVar3;
      auVar7._0_8_ = -(dVar5 + dVar5 + dVar2);
      auVar7._8_8_ = (dVar5 + dVar5) - dVar2;
      auVar8._8_8_ = dVar4;
      auVar8._0_8_ = dVar4;
      auVar8 = divpd(auVar7,auVar8);
      dVar2 = ((this->ad / jMax - (dVar3 + dVar3)) - auVar8._8_8_) + this->tf;
      (profile->t)._M_elems[1] = dVar2;
      *(undefined1 (*) [16])((profile->t)._M_elems + 2) = auVar8;
      (profile->t)._M_elems[4] = this->tf - (dVar2 + dVar3 + auVar8._0_8_ + auVar8._8_8_);
      (profile->t)._M_elems[5] = 0.0;
      (profile->t)._M_elems[6] = 0.0;
      bVar1 = Profile::
              check<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)2,false>
                        (profile,jMax,vMax,vMin,aMax,aMin);
      return bVar1;
    }
  }
  return true;
}

Assistant:

bool PositionThirdOrderStep2::time_acc0(Profile& profile, double vMax, double vMin, double aMax, double aMin, double jMax) {
    // UDUD
    {
        const double h1 = std::sqrt(ad_ad/(2*jMax_jMax) - ad*(aMax - a0)/(jMax_jMax) + (aMax*tf - vd)/jMax);

        profile.t[0] = (aMax - a0)/jMax;
        profile.t[1] = tf - ad/jMax - 2*h1;
        profile.t[2] = h1;
        profile.t[3] = 0;
        profile.t[4] = (af - aMax)/jMax + h1;
        profile.t[5] = 0;
        profile.t[6] = 0;

        if (profile.check_with_timing<ControlSigns::UDUD, ReachedLimits::NONE>(tf, jMax, vMax, vMin, aMax, aMin)) {
            return true;
        }
    }

    // UDUD
    {
        const double h0a = -a0_a0 + af_af - 2*ad*aMax + 2*jMax*(aMax*tf - vd);
        const double h0b = a0_p3 + 2*af_p3 - 6*af_af*aMax - 3*a0_a0*(af - jMax*tf) - 3*a0*aMax*(aMax - 2*af + 2*jMax*tf) - 3*jMax*(jMax*(-2*pd + aMax*tf_tf + 2*tf*v0) + aMax*(aMax*tf - 2*vd)) + 3*af*(aMax*aMax + 2*aMax*jMax*tf - 2*jMax*vd);
        const double h0 = std::abs(jMax) * std::sqrt(4*h0b*h0b - 18*h0a*h0a*h0a);
        const double h1 = 3*jMax*h0a;

        profile.t[0] = (-a0 + aMax)/jMax;
        profile.t[1] = (-a0_p3 + af_p3 + af_af*(-6*aMax + 3*jMax*tf) + a0_a0*(-3*af + 6*aMax + 3*jMax*tf) + 6*af*(aMax*aMax - jMax*vd) + 3*a0*(af_af - 2*(aMax*aMax + jMax*vd)) - 6*jMax*(aMax*(aMax*tf - 2*vd) + jMax*g2))/h1;
        profile.t[2] = -(ad + h0/h1)/(2*jMax) + tf/2 - profile.t[1]/2;
        profile.t[3] = h0/(jMax*h1);
        profile.t[4] = 0;
        profile.t[5] = 0;
        profile.t[6] = tf - (profile.t[0] + profile.t[1] + profile.t[2] + profile.t[3]);

        if (profile.check_with_timing<ControlSigns::UDDU, ReachedLimits::NONE>(tf, jMax, vMax, vMin, aMax, aMin)) {
            return true;
        }
    }

    // a3 != 0

    // UDDU Solution 1
    {
        const double h0a = a0_p3 + 2*af_p3 - 6*(af_af + aMax*aMax)*aMax - 6*(a0 + af)*aMax*jMax*tf + 9*aMax*aMax*(af + jMax*tf) + 3*a0*aMax*(-2*af + 3*aMax) + 3*a0_a0*(af - 2*aMax + jMax*tf) - 6*jMax_jMax*g1 + 6*(af - aMax)*jMax*vd - 3*aMax*jMax_jMax*tf_tf;
        const double h0b = a0_a0 + af_af + 2*(aMax*aMax - (a0 + af)*aMax + jMax*(vd - aMax*tf));
        const double h1 = std::abs(jMax)/jMax * std::sqrt(4*h0a*h0a - 18*h0b*h0b*h0b);
        const double h2 = 6*jMax*h0b;

        profile.t[0] = (-a0 + aMax)/jMax;
        profile.t[1] = ad/jMax - 2 * profile.t[0] - (2*h0a - h1)/h2 + tf;
        profile.t[2] = -(2*h0a + h1)/h2;
        profile.t[3] = (2*h0a - h1)/h2;
        profile.t[4] = tf - (profile.t[0] + profile.t[1] + profile.t[2] + profile.t[3]);
        profile.t[5] = 0;
        profile.t[6] = 0;

        if (profile.check_with_timing<ControlSigns::UDDU, ReachedLimits::ACC0>(tf, jMax, vMax, vMin, aMax, aMin)) {
            return true;
        }
    }

    return false;
}